

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_fast.c
# Opt level: O2

void lzma_lzma_optimum_fast
               (lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  uint32_t uVar4;
  uint uVar5;
  undefined4 extraout_var;
  ulong uVar7;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint32_t uVar17;
  uint32_t matches_count;
  uint32_t *local_60;
  uint32_t *local_58;
  ulong local_50;
  lzma_match *local_48;
  uint8_t *local_40;
  ulong local_38;
  ulong uVar6;
  ulong uVar8;
  
  uVar16 = mf->nice_len;
  if (mf->read_ahead == 1) {
    matches_count = coder->matches_count;
    uVar6 = (ulong)coder->longest_match_length;
  }
  else {
    if (mf->read_ahead != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_fast.c"
                    ,0x26,
                    "void lzma_lzma_optimum_fast(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict)"
                   );
    }
    uVar4 = lzma_mf_find(mf,&matches_count,coder->matches);
    uVar6 = CONCAT44(extraout_var,uVar4);
  }
  uVar10 = (ulong)mf->read_pos;
  uVar9 = (mf->write_pos - mf->read_pos) + 1;
  if (uVar9 < 2) {
    *back_res = 0xffffffff;
    *len_res = 1;
    return;
  }
  puVar1 = mf->buffer;
  uVar15 = 0x111;
  if (uVar9 < 0x111) {
    uVar15 = uVar9;
  }
  uVar4 = 0;
  uVar12 = 0;
  for (lVar13 = 0; uVar11 = (uint)uVar12, local_50 = uVar6, local_60 = back_res, local_58 = len_res,
      local_40 = puVar1, local_38 = uVar10, lVar13 != 4; lVar13 = lVar13 + 1) {
    if (*(short *)(puVar1 + (uVar10 - 1)) ==
        *(short *)(puVar1 + (uVar10 - coder->reps[lVar13]) + -2)) {
      for (uVar7 = 2;
          (uVar8 = (ulong)uVar15, uVar7 < uVar15 &&
          (uVar8 = uVar7,
          puVar1[uVar7 + (uVar10 - 1)] == puVar1[uVar7 + (uVar10 - coder->reps[lVar13]) + -2]));
          uVar7 = uVar7 + 1) {
      }
      uVar5 = (uint)uVar8;
      if (uVar16 <= uVar5) {
        *back_res = (uint32_t)lVar13;
        *len_res = uVar5;
        uVar4 = uVar5 - 1;
        goto LAB_0042c1b8;
      }
      if (uVar11 < uVar5) {
        uVar12 = uVar8 & 0xffffffff;
        uVar4 = (uint32_t)lVar13;
      }
    }
  }
  uVar15 = (uint)uVar6;
  if (uVar15 < uVar16) {
    uVar17 = 0;
    if (1 < uVar15) {
      uVar7 = (ulong)matches_count;
      uVar12 = uVar6;
      uVar17 = coder->matches[matches_count - 1].dist;
      while (((uVar16 = (uint)uVar12, 1 < uVar7 &&
              (lVar13 = uVar7 * 2, uVar16 == coder->reps[lVar13] + 1)) &&
             (uVar15 = coder->matches[uVar7 - 2].dist, uVar15 < uVar17 >> 7))) {
        uVar7 = uVar7 - 1;
        matches_count = (uint32_t)uVar7;
        uVar12 = (ulong)coder->reps[lVar13];
        uVar17 = uVar15;
      }
      uVar15 = 1;
      if (uVar17 < 0x80) {
        uVar15 = uVar16;
      }
      if (uVar16 != 2) {
        uVar15 = uVar16;
      }
      local_50 = (ulong)uVar15;
    }
    uVar16 = (uint)local_50;
    if ((uVar11 < 2) ||
       (((uVar11 + 1 < uVar16 && ((uVar11 + 2 < uVar16 || (uVar17 < 0x201)))) &&
        ((uVar11 + 3 < uVar16 || (uVar17 < 0x8001)))))) {
      if ((uVar9 == 2) || (uVar16 < 2)) goto LAB_0042c225;
      local_48 = coder->matches;
      uVar4 = lzma_mf_find(mf,&coder->matches_count,local_48);
      coder->longest_match_length = uVar4;
      uVar16 = (uint)local_50;
      if (1 < uVar4) {
        uVar9 = local_48[coder->matches_count - 1].dist;
        if ((uVar16 <= uVar4) && (uVar9 < uVar17)) {
LAB_0042c225:
          *local_60 = 0xffffffff;
          *local_58 = 1;
          return;
        }
        if (((uVar16 + 1 < uVar4) || (uVar4 == uVar16 + 1 && uVar9 >> 7 <= uVar17)) ||
           (((2 < uVar16 && (uVar16 <= uVar4 + 1)) && (uVar9 < uVar17 >> 7)))) goto LAB_0042c225;
      }
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        if (*(short *)(local_40 + local_38) ==
            *(short *)(puVar1 + ~(ulong)coder->reps[lVar13] + uVar10)) {
          lVar14 = 0;
          do {
            if ((ulong)(uVar16 - 1) <= lVar14 + 2U) goto LAB_0042c225;
            lVar2 = lVar14 + 2;
            lVar3 = lVar14 + ((uVar10 + 1) - (ulong)coder->reps[lVar13]);
            lVar14 = lVar14 + 1;
          } while (*(uint8_t *)((long)(local_40 + local_38) + lVar2) == puVar1[lVar3]);
        }
      }
      *local_60 = uVar17 + 4;
      *local_58 = uVar16;
      uVar4 = uVar16 - 2;
    }
    else {
      *back_res = uVar4;
      *len_res = uVar11;
      uVar4 = uVar11 - 1;
      local_50 = uVar6;
    }
  }
  else {
    *back_res = coder->matches[matches_count - 1].dist + 4;
    *len_res = uVar15;
    uVar4 = uVar15 - 1;
  }
LAB_0042c1b8:
  mf_skip(mf,uVar4);
  return;
}

Assistant:

extern void
lzma_lzma_optimum_fast(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint32_t *LZMA_RESTRICT back_res, uint32_t *LZMA_RESTRICT len_res)
{
	const uint8_t *buf;
	uint32_t buf_avail;
	uint32_t i;
	uint32_t rep_len = 0;
	uint32_t rep_index = 0;
	uint32_t back_main = 0;
	uint32_t limit;

	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;
	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	buf = mf_ptr(mf) - 1;
	buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);

	if (buf_avail < 2) {
		// There's not enough input left to encode a match.
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Look for repeated matches; scan the previous four match distances
	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t len;

		// Pointer to the beginning of the match candidate
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		// If the first two bytes (2 == MATCH_LEN_MIN) do not match,
		// this rep is not useful.
		if (not_equal_16(buf, buf_back))
			continue;

		// The first two bytes matched.
		// Calculate the length of the match.
		for (len = 2; len < buf_avail
				&& buf[len] == buf_back[len]; ++len) ;

		// If we have found a repeated match that is at least
		// nice_len long, return it immediately.
		if (len >= nice_len) {
			*back_res = i;
			*len_res = len;
			mf_skip(mf, len - 1);
			return;
		}

		if (len > rep_len) {
			rep_index = i;
			rep_len = len;
		}
	}

	// We didn't find a long enough repeated match. Encode it as a normal
	// match if the match length is at least nice_len.
	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist
				+ REP_DISTANCES;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return;
	}

	if (len_main >= 2) {
		back_main = coder->matches[matches_count - 1].dist;

		while (matches_count > 1 && len_main ==
				coder->matches[matches_count - 2].len + 1) {
			if (!change_pair(coder->matches[
						matches_count - 2].dist,
					back_main))
				break;

			--matches_count;
			len_main = coder->matches[matches_count - 1].len;
			back_main = coder->matches[matches_count - 1].dist;
		}

		if (len_main == 2 && back_main >= 0x80)
			len_main = 1;
	}

	if (rep_len >= 2) {
		if (rep_len + 1 >= len_main
				|| (rep_len + 2 >= len_main
					&& back_main > (UINT32_C(1) << 9))
				|| (rep_len + 3 >= len_main
					&& back_main > (UINT32_C(1) << 15))) {
			*back_res = rep_index;
			*len_res = rep_len;
			mf_skip(mf, rep_len - 1);
			return;
		}
	}

	if (len_main < 2 || buf_avail <= 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Get the matches for the next byte. If we find a better match,
	// the current byte is encoded as a literal.
	coder->longest_match_length = mf_find(mf,
			&coder->matches_count, coder->matches);

	if (coder->longest_match_length >= 2) {
		const uint32_t new_dist = coder->matches[
				coder->matches_count - 1].dist;

		if ((coder->longest_match_length >= len_main
					&& new_dist < back_main)
				|| (coder->longest_match_length == len_main + 1
					&& !change_pair(back_main, new_dist))
				|| (coder->longest_match_length > len_main + 1)
				|| (coder->longest_match_length + 1 >= len_main
					&& len_main >= 3
					&& change_pair(new_dist, back_main))) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	// In contrast to LZMA SDK, dictionary could not have been moved
	// between mf_find() calls, thus it is safe to just increment
	// the old buf pointer instead of recalculating it with mf_ptr().
	++buf;

	limit = len_main - 1;

	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t len;

		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		if (not_equal_16(buf, buf_back))
			continue;

		for (len = 2; len < limit
				&& buf[len] == buf_back[len]; ++len) ;

		if (len >= limit) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	*back_res = back_main + REP_DISTANCES;
	*len_res = len_main;
	mf_skip(mf, len_main - 2);
	return;
}